

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_number<unsigned_char>(TextReader *this,uchar *value)

{
  bool bVar1;
  int in_R8D;
  string_view str;
  string_view sVar2;
  
  sVar2 = read_word(this);
  if ((ritobin *)sVar2._M_len != (ritobin *)0x0) {
    str._M_str = (char *)value;
    str._M_len = (size_t)sVar2._M_str;
    bVar1 = to_num<unsigned_char>((ritobin *)sVar2._M_len,str,(uchar *)0xa,in_R8D);
    return bVar1;
  }
  return false;
}

Assistant:

bool read_number(T& value) noexcept {
            static_assert (std::is_arithmetic_v<T>);
            auto const word = read_word();
            if (word.empty()) {
                return false;
            }
            return to_num(word, value);
        }